

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

void nk_command_buffer_reset(nk_command_buffer *buffer)

{
  nk_command_buffer *buffer_local;
  
  if (buffer == (nk_command_buffer *)0x0) {
    __assert_fail("buffer",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/drobilla[P]glfw/deps/nuklear.h"
                  ,0x17a8,"void nk_command_buffer_reset(struct nk_command_buffer *)");
  }
  if (buffer != (nk_command_buffer *)0x0) {
    buffer->begin = 0;
    buffer->end = 0;
    buffer->last = 0;
    (buffer->clip).x = -8192.0;
    (buffer->clip).y = -8192.0;
    (buffer->clip).w = 16384.0;
    (buffer->clip).h = 16384.0;
  }
  return;
}

Assistant:

NK_INTERN void
nk_command_buffer_reset(struct nk_command_buffer *buffer)
{
    NK_ASSERT(buffer);
    if (!buffer) return;
    buffer->begin = 0;
    buffer->end = 0;
    buffer->last = 0;
    buffer->clip = nk_null_rect;
#ifdef NK_INCLUDE_COMMAND_USERDATA
    buffer->userdata.ptr = 0;
#endif
}